

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_utils.c
# Opt level: O3

int count_rows_db(feed_db_t *db,char *table_name)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  char *pcVar4;
  sqlite3_stmt *stmt;
  sqlite3_stmt *local_30;
  
  sVar3 = strlen(table_name);
  sVar3 = (size_t)((int)sVar3 + 0x19);
  __s = (char *)malloc(sVar3);
  if (__s == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    snprintf(__s,sVar3,"SELECT count(*) FROM `%s`;",table_name);
    iVar2 = -1;
    sqlite3_prepare_v2(db->conn,__s,-1,&local_30,(char **)0x0);
    iVar1 = sqlite3_step(local_30);
    db->rc = iVar1;
    if (iVar1 == 100) {
      iVar2 = sqlite3_column_int(local_30,0);
    }
    else {
      pcVar4 = sqlite3_errmsg(db->conn);
      pcVar4 = strdup(pcVar4);
      db->error_msg = pcVar4;
    }
    sqlite3_finalize(local_30);
    free(__s);
  }
  return iVar2;
}

Assistant:

int count_rows_db(feed_db_t *db, const char *table_name) {
    int count = -1;
    sqlite3_stmt *stmt;

    int query_buf_len = 25 + strlen(table_name);
    char *query_buf = malloc(sizeof(char) * query_buf_len);
    if (query_buf == NULL) {
        return -1;
    }

    snprintf(query_buf, query_buf_len, "SELECT count(*) FROM `%s`;", table_name);

    sqlite3_prepare_v2(db->conn, query_buf, -1, &stmt, NULL);
    db->rc = sqlite3_step(stmt);

    if (db->rc == SQLITE_ROW) {
        count = sqlite3_column_int(stmt, 0);
    } else {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
    }

    sqlite3_finalize(stmt);
    free(query_buf);
    return count;
}